

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O3

bool try_quantize_rgb_delta_blue_contract
               (vfloat4 color0,vfloat4 color1,vint4 *color0_out,vint4 *color1_out,
               quant_method quant_level)

{
  undefined8 in_RAX;
  uint uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  auVar6._8_56_ = color0._16_56_;
  auVar6._0_8_ = color0.m._8_8_;
  auVar3._8_56_ = color0._8_56_;
  auVar3._0_8_ = color0.m._0_8_;
  auVar2 = auVar6._0_16_;
  auVar11 = vshufps_avx(auVar2,auVar2,0xea);
  auVar11 = vsubps_avx(auVar2,auVar11);
  auVar8._0_4_ = auVar11._0_4_ + color0.m[2];
  auVar8._4_4_ = auVar11._4_4_ + color0.m[3];
  auVar8._8_4_ = auVar11._8_4_ + color0._16_4_;
  auVar8._12_4_ = auVar11._12_4_ + color0._20_4_;
  auVar2 = auVar3._0_16_;
  auVar11 = vshufps_avx(auVar2,auVar2,0xea);
  auVar11 = vsubps_avx(auVar2,auVar11);
  auVar12._0_4_ = auVar11._0_4_ + color0.m[0];
  auVar12._4_4_ = auVar11._4_4_ + color0.m[1];
  auVar12._8_4_ = auVar11._8_4_ + color0.m[2];
  auVar12._12_4_ = auVar11._12_4_ + color0.m[3];
  auVar7 = ZEXT816(0) << 0x20;
  auVar11 = vcmpps_avx(auVar8,auVar7,1);
  auVar10._8_4_ = 0x437f0000;
  auVar10._0_8_ = 0x437f0000437f0000;
  auVar10._12_4_ = 0x437f0000;
  auVar2 = vcmpps_avx(auVar10,auVar8,1);
  auVar4 = vcmpps_avx(auVar12,auVar7,1);
  auVar4 = vorps_avx(auVar4,auVar11);
  auVar11 = vcmpps_avx(auVar10,auVar12,1);
  auVar11 = vorps_avx(auVar11,auVar2);
  auVar11 = vorps_avx(auVar11,auVar4);
  if ((((auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar11[0xf]) {
    auVar2._0_4_ = (int)(auVar8._0_4_ + 0.5);
    auVar2._4_4_ = (int)(auVar8._4_4_ + 0.5);
    auVar2._8_4_ = (int)(auVar8._8_4_ + 0.5);
    auVar2._12_4_ = (int)(auVar8._12_4_ + 0.5);
    auVar11 = vpaddd_avx(auVar2,auVar2);
    auVar2 = vpslld_avx(auVar2,2);
    auVar15._8_4_ = 0x1fc;
    auVar15._0_8_ = 0x1fc000001fc;
    auVar15._12_4_ = 0x1fc;
    auVar9._8_4_ = 1;
    auVar9._0_8_ = 0x100000001;
    auVar9._12_4_ = 1;
    auVar2 = vpand_avx(auVar2,auVar15);
    auVar2 = vpor_avx(auVar2,auVar9);
    uVar1 = quant_level - QUANT_6;
    auVar4 = vpunpckldq_avx(ZEXT116(color_unquant_to_uquant_tables[uVar1]
                                    [CONCAT44((int)((ulong)in_RAX >> 0x20),auVar2._0_4_)]),
                            ZEXT116(color_unquant_to_uquant_tables[uVar1][auVar2._4_4_]));
    auVar8 = vpunpcklqdq_avx(auVar4,ZEXT116(color_unquant_to_uquant_tables[uVar1][auVar2._8_4_]));
    auVar4._0_4_ = (int)(auVar12._0_4_ + 0.5);
    auVar4._4_4_ = (int)(auVar12._4_4_ + 0.5);
    auVar4._8_4_ = (int)(auVar12._8_4_ + 0.5);
    auVar4._12_4_ = (int)(auVar12._12_4_ + 0.5);
    auVar2 = vpaddd_avx(auVar4,auVar4);
    auVar5._8_4_ = 0x100;
    auVar5._0_8_ = 0x10000000100;
    auVar5._12_4_ = 0x100;
    auVar11 = vpand_avx(auVar11,auVar5);
    auVar4 = vpor_avx(auVar11,auVar8);
    auVar11 = vpsubd_avx(auVar2,auVar4);
    auVar12 = vpblendd_avx2(auVar11,auVar7,8);
    auVar7._8_4_ = 0xffffffc0;
    auVar7._0_8_ = 0xffffffc0ffffffc0;
    auVar7._12_4_ = 0xffffffc0;
    auVar16._8_4_ = 0xffffff7f;
    auVar16._0_8_ = 0xffffff7fffffff7f;
    auVar16._12_4_ = 0xffffff7f;
    auVar11 = vpaddd_avx(auVar12,auVar7);
    auVar2 = vpminud_avx(auVar11,auVar16);
    auVar11 = vpcmpeqd_avx(auVar11,auVar2);
    if ((((auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar11[0xf]) {
      auVar17._8_8_ = 0x7f0000007f;
      auVar17._0_8_ = 0x7f0000007f;
      auVar11 = vpand_avx(auVar12,auVar17);
      auVar2 = vpsrld_avx(auVar4,1);
      auVar18._8_8_ = 0x8000000080;
      auVar18._0_8_ = 0x8000000080;
      auVar2 = vpand_avx(auVar2,auVar18);
      auVar2 = vpor_avx(auVar11,auVar2);
      auVar11 = vpaddd_avx(auVar2,auVar2);
      auVar11 = vpor_avx(auVar11,auVar9);
      auVar4 = vpunpckldq_avx(ZEXT116(color_unquant_to_uquant_tables[uVar1][auVar11._0_4_]),
                              ZEXT116(color_unquant_to_uquant_tables[uVar1][auVar11._4_4_]));
      auVar4 = vpunpcklqdq_avx(auVar4,ZEXT116(color_unquant_to_uquant_tables[uVar1][auVar11._8_4_]))
      ;
      auVar11._8_4_ = 0xc0;
      auVar11._0_8_ = 0xc0000000c0;
      auVar11._12_4_ = 0xc0;
      auVar11 = vpand_avx(auVar4 ^ auVar2,auVar11);
      auVar11 = vpblendd_avx2(auVar11,(undefined1  [16])0x0,8);
      if (auVar11 == (undefined1  [16])0x0) {
        auVar11 = vpsrld_avx(auVar4,1);
        auVar13._8_4_ = 0x3f;
        auVar13._0_8_ = 0x3f0000003f;
        auVar13._12_4_ = 0x3f;
        auVar11 = vpand_avx(auVar11,auVar13);
        auVar2 = vpslld_avx(auVar4,0x19);
        auVar2 = vpsrad_avx(auVar2,0x1f);
        auVar2 = vpand_avx(auVar2,auVar7);
        auVar2 = vpor_avx(auVar11,auVar2);
        auVar11 = vphaddd_avx(auVar2,auVar2);
        auVar12 = vpshufd_avx(auVar2,0xee);
        auVar11 = vpaddd_avx(auVar11,auVar12);
        if (auVar11._0_4_ < 0) {
          auVar12 = vpsrld_avx(auVar8,1);
          auVar14._8_4_ = 0x80;
          auVar14._0_8_ = 0x8000000080;
          auVar14._12_4_ = 0x80;
          auVar11 = vpand_avx(auVar4,auVar14);
          auVar11 = vpor_avx(auVar11,auVar12);
          auVar11 = vpaddd_avx(auVar11,auVar2);
          auVar2 = vpmaxud_avx(auVar11,auVar5);
          auVar11 = vpcmpeqd_avx(auVar11,auVar2);
          if ((((auVar11 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar11 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar11 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar11[0xf]) {
            *(undefined1 (*) [16])color0_out->m = auVar8;
            *(undefined1 (*) [16])color1_out->m = auVar4;
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool try_quantize_rgb_delta_blue_contract(
	vfloat4 color0,
	vfloat4 color1,
	vint4& color0_out,
	vint4& color1_out,
	quant_method quant_level
) {
	// Note: Switch around endpoint colors already at start
	std::swap(color0, color1);

	// Apply inverse blue-contraction
	color0 += color0 - color0.swz<2, 2, 2, 3>();
	color1 += color1 - color1.swz<2, 2, 2, 3>();

	// If anything overflows BC cannot be used
	vmask4 color0_error = (color0 < vfloat4(0.0f)) | (color0 > vfloat4(255.0f));
	vmask4 color1_error = (color1 < vfloat4(0.0f)) | (color1 > vfloat4(255.0f));
	if (any(color0_error | color1_error))
	{
		return false;
	}

	// Transform color0 to unorm9
	vint4 color0a = float_to_int_rtn(color0);
	color0.set_lane<3>(0.0f);
	color0a = lsl<1>(color0a);

	// Mask off the top bit
	vint4 color0b = color0a & 0xFF;

	// Quantize then unquantize in order to get a value that we take differences against
	vint4 color0be = quant_color3(quant_level, color0b);
	color0b = color0be | (color0a & 0x100);

	// Get hold of the second value
	vint4 color1d = float_to_int_rtn(color1);
	color1d = lsl<1>(color1d);

	// ... and take differences
	color1d = color1d - color0b;
	color1d.set_lane<3>(0);

	// Check if the difference is too large to be encodable
	if (any((color1d > vint4(63)) | (color1d < vint4(-64))))
	{
		return false;
	}

	// Insert top bit of the base into the offset
	color1d = color1d & 0x7F;
	color1d = color1d | lsr<1>(color0b & 0x100);

	// Then quantize and unquantize; if this causes either top two bits to flip, then encoding fails
	// since we have then corrupted either the top bit of the base or the sign bit of the offset
	vint4 color1de = quant_color3(quant_level, color1d);

	vint4 color_flips = (color1d ^ color1de) & 0xC0;
	color_flips.set_lane<3>(0);
	if (any(color_flips != vint4::zero()))
	{
		return false;
	}

	// If the sum of offsets does not trigger blue-contraction then encoding fails
	vint4 ep0 = color0be;
	vint4 ep1 = color1de;
	bit_transfer_signed(ep1, ep0);
	if (hadd_rgb_s(ep1) >= 0)
	{
		return false;
	}

	// Check that the offsets produce legitimate sums as well
	ep0 = ep0 + ep1;
	if (any((ep0 < vint4(0)) | (ep0 > vint4(0xFF))))
	{
		return false;
	}

	color0_out = color0be;
	color1_out = color1de;
	return true;
}